

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O2

void cg_statement(dill_stream s,sm_ref stmt,cod_code descr)

{
  sm_ref psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  dill_reg dVar5;
  int *piVar6;
  jmp_op UNRECOVERED_JUMPTABLE;
  operand local_4c;
  
  do {
    if (stmt == (sm_ref)0x0) {
      return;
    }
    switch(stmt->node_type) {
    case cod_compound_statement:
      cg_compound_statement(s,stmt,descr);
      return;
    default:
      puts("unhandled case in cg_statement");
      return;
    case cod_label_statement:
      dill_mark_label(s,(stmt->node).label_statement.cg_label);
      stmt = (stmt->node).declaration.freeable_complex_type;
      break;
    case cod_return_statement:
      iVar2 = (stmt->node).label_statement.cg_label;
      if (iVar2 != 0xb) {
        iVar3 = cod_sm_get_type((stmt->node).return_statement.expression);
        cg_expr(&local_4c,s,(stmt->node).return_statement.expression,0,descr);
        dVar5 = coerce_type(s,local_4c.reg,iVar2,iVar3);
        (*s->j->ret)(s,iVar2,0,dVar5);
        return;
      }
      (*s->j->reti)(s,4,0,0);
      return;
    case cod_jump_statement:
      if ((stmt->node).compound_statement.statements == (sm_list)0x0) {
        psVar1 = (stmt->node).declaration.freeable_complex_type;
        UNRECOVERED_JUMPTABLE = s->j->jv;
        if ((stmt->node).jump_statement.continue_flag == 1) {
          piVar6 = &(psVar1->node).iteration_statement.cg_iter_label;
        }
        else {
          piVar6 = &(psVar1->node).iteration_statement.cg_end_label;
        }
      }
      else {
        UNRECOVERED_JUMPTABLE = s->j->jv;
        piVar6 = &(((stmt->node).declaration.freeable_complex_type)->node).label_statement.cg_label;
      }
      (*UNRECOVERED_JUMPTABLE)(s,(long)*piVar6);
      return;
    case cod_selection_statement:
      iVar2 = dill_alloc_label(s,"else");
      cg_branch_if_false(s,(stmt->node).return_statement.expression,iVar2,descr,0);
      cg_statement(s,(stmt->node).enumerator.const_expression,descr);
      if ((stmt->node).declaration.freeable_complex_type != (sm_ref)0x0) {
        iVar3 = dill_alloc_label(s,"if-end");
        (*s->j->jv)(s,(long)iVar3);
        dill_mark_label(s,iVar2);
        cg_statement(s,(stmt->node).declaration.freeable_complex_type,descr);
        iVar2 = iVar3;
      }
      dill_mark_label(s,iVar2);
      return;
    case cod_iteration_statement:
      iVar2 = dill_alloc_label(s,"loop begin");
      iVar3 = dill_alloc_label(s,"loop end");
      iVar4 = dill_alloc_label(s,"loop iteration");
      (stmt->node).iteration_statement.cg_end_label = iVar3;
      (stmt->node).iteration_statement.cg_iter_label = iVar4;
      psVar1 = (stmt->node).return_statement.expression;
      if (psVar1 != (sm_ref)0x0) {
        cg_expr(&local_4c,s,psVar1,0,descr);
      }
      dill_mark_label(s,iVar2);
      psVar1 = (stmt->node).enumerator.const_expression;
      if (psVar1 != (sm_ref)0x0) {
        cg_branch_if_false(s,psVar1,iVar3,descr,0);
      }
      cg_statement(s,(stmt->node).iteration_statement.statement,descr);
      dill_mark_label(s,iVar4);
      psVar1 = (stmt->node).iteration_statement.iter_expr;
      if (psVar1 != (sm_ref)0x0) {
        cg_expr(&local_4c,s,psVar1,0,descr);
      }
      psVar1 = (stmt->node).declaration.freeable_complex_type;
      if (psVar1 == (sm_ref)0x0) {
        (*s->j->jv)(s,(long)iVar2);
      }
      else {
        cg_branch_if_false(s,psVar1,iVar2,descr,1);
      }
      dill_mark_label(s,iVar3);
      return;
    case cod_expression_statement:
      cg_expr(&local_4c,s,(stmt->node).return_statement.expression,0,descr);
      return;
    }
  } while( true );
}

Assistant:

static void
cg_statement(dill_stream s, sm_ref stmt, cod_code descr)
{
    if (!stmt) return;
    switch(stmt->node_type) {
    case cod_selection_statement:
	cg_selection_statement(s, stmt, descr);
	break;
    case cod_iteration_statement:
	cg_iteration_statement(s, stmt, descr);
	break;
    case cod_expression_statement: 
	(void) cg_expr(s, stmt->node.expression_statement.expression, 0, descr);
	break;
    case cod_compound_statement:
	cg_compound_statement(s, stmt, descr);
	break;
    case cod_return_statement:
	cg_return_statement(s, stmt, descr);
	break;
    case cod_jump_statement:
	cg_jump_statement(s, stmt, descr);
	break;
    case cod_label_statement: {
	dill_mark_label(s, stmt->node.label_statement.cg_label);
	cg_statement(s, stmt->node.label_statement.statement, descr);
	break;
    }
    default:
	printf("unhandled case in cg_statement\n");
    }
}